

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

string * OpenMD::UpperCase(string *__return_storage_ptr__,string *S)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  uint j;
  ulong uVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)S);
  sVar3 = __return_storage_ptr__->_M_string_length;
  for (uVar4 = 0; (uint)sVar3 != uVar4; uVar4 = uVar4 + 1) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = pcVar2[uVar4];
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      pcVar2[uVar4] = cVar1 + -0x20;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UpperCase(const std::string& S) {
    std::string uc = S;
    unsigned int n = uc.size();
    for (unsigned int j = 0; j < n; j++) {
      char sj = uc[j];
      if (sj >= 'a' && sj <= 'z') uc[j] = (char)(sj - ('a' - 'A'));
    }
    return uc;
  }